

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

void test_readcb(int fd,short what,void *_arg)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  size_t len;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  timeval local_10f0;
  long local_10e0;
  sockaddr_in google_addrs [2];
  char ip_str [55];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  char buf [4096];
  
  if (((((what & 1U) != 0) ||
       (len = recvfrom(fd,buf,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0), len + 1 < 0xd)) ||
      ((buf[3] & 0xfU) != 0)) || (buf._0_2_ != *(short *)((long)_arg + 0x28))) goto LAB_001076e2;
  fmt_sockaddr_port((sockaddr *)(*(long *)((long)_arg + 0x18) + 0x10),ip_str,0x37);
  gettimeofday(&local_10f0,(__timezone_ptr_t)0x0);
  lVar4 = local_10f0.tv_sec - *(long *)((long)_arg + 8);
  lVar7 = local_10f0.tv_usec - *(long *)((long)_arg + 0x10);
  lVar8 = lVar7 + 1000000;
  if (-1 < lVar7) {
    lVar8 = lVar7;
  }
  local_10e0 = lVar8 / 1000;
  lVar6 = *(long *)((long)_arg + 0x18);
  uVar1 = *(uint *)(lVar6 + 0x90);
  *(ushort *)(lVar6 + 0x90) = (ushort)uVar1 | 0x8000;
  if ((uVar1 & 1) == 0) {
    uVar2 = dns_get_edns_udp_payload_size(buf,len);
    lVar6 = *(long *)((long)_arg + 0x18);
    *(uint16_t *)(lVar6 + 0x92) = uVar2;
    if ((uVar2 != 0) && ((*(byte *)(lVar6 + 0x91) & 0x40) == 0)) {
      google_addrs[0].sin_family = 2;
      google_addrs[0].sin_port = 0;
      google_addrs[0].sin_addr.s_addr = inet_addr("8.8.8.8");
      google_addrs[0].sin_zero[0] = '\0';
      google_addrs[0].sin_zero[1] = '\0';
      google_addrs[0].sin_zero[2] = '\0';
      google_addrs[0].sin_zero[3] = '\0';
      google_addrs[0].sin_zero[4] = '\0';
      google_addrs[0].sin_zero[5] = '\0';
      google_addrs[0].sin_zero[6] = '\0';
      google_addrs[0].sin_zero[7] = '\0';
      google_addrs[1].sin_family = 2;
      google_addrs[1].sin_port = 0;
      google_addrs[1].sin_addr.s_addr = inet_addr("8.8.4.4");
      google_addrs[1].sin_zero[0] = '\0';
      google_addrs[1].sin_zero[1] = '\0';
      google_addrs[1].sin_zero[2] = '\0';
      google_addrs[1].sin_zero[3] = '\0';
      google_addrs[1].sin_zero[4] = '\0';
      google_addrs[1].sin_zero[5] = '\0';
      google_addrs[1].sin_zero[6] = '\0';
      google_addrs[1].sin_zero[7] = '\0';
      uStack_1070 = 0;
      local_1068 = 0;
      local_1048 = 0;
      local_1058 = 0;
      uStack_1050 = 0;
      local_1078 = 10;
      uStack_1060 = 0xa00000000;
      evutil_inet_pton(10,"2001:4860:4860::8888");
      evutil_inet_pton(10,"2001:4860:4860::8844",(long)&local_1058 + 4);
      if (*(short *)(lVar6 + 0x10) == 2) {
        uVar5 = 0;
        do {
          if (0x1f < uVar5) goto LAB_00107535;
          iVar3 = evutil_sockaddr_cmp(google_addrs[0].sin_zero + (uVar5 - 8),lVar6 + 0x10,0);
          uVar5 = uVar5 + 0x10;
        } while (iVar3 != 0);
LAB_00107519:
        lVar6 = *(long *)((long)_arg + 0x18);
        if (*(short *)(lVar6 + 0x92) != 0x200) {
          *(byte *)(lVar6 + 0x91) = *(byte *)(lVar6 + 0x91) | 0x40;
        }
      }
      else {
        if (*(short *)(lVar6 + 0x10) == 10) {
          uVar5 = 0;
          do {
            if (0x37 < uVar5) goto LAB_00107535;
            iVar3 = evutil_sockaddr_cmp((long)&local_1078 + uVar5,lVar6 + 0x10,0);
            uVar5 = uVar5 + 0x1c;
          } while (iVar3 != 0);
          goto LAB_00107519;
        }
LAB_00107535:
        lVar6 = *(long *)((long)_arg + 0x18);
      }
      if ((*(byte *)(lVar6 + 0x91) & 0x40) != 0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x2dc,"test_readcb",0,6,
                   "Oops! DNS server %s is hijacked with UDP payload size: %u",ip_str,
                   (ulong)*(ushort *)(lVar6 + 0x92));
        lVar6 = *(long *)((long)_arg + 0x18);
      }
    }
    if ((*(ushort *)(lVar6 + 0x92) != 0) && ((*(uint *)(lVar6 + 0x90) >> 0xe & 1) == 0)) {
      *(ushort *)(lVar6 + 0x90) = (ushort)*(uint *)(lVar6 + 0x90) | 1;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2e2
                 ,"test_readcb",0,6,"Cool! DNS server %s supports EDNS with UDP payload size: %u",
                 ip_str,(ulong)*(ushort *)(lVar6 + 0x92));
      lVar6 = *(long *)((long)_arg + 0x18);
    }
  }
  if (((*(ushort *)(lVar6 + 0x90) & 0x4002) == 0) && (buf._8_2_ != 0)) {
    *(ushort *)(lVar6 + 0x90) = *(ushort *)(lVar6 + 0x90) | 2;
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2e8,
               "test_readcb",0,6,"Cool! DNS server %s returns authority records",ip_str);
    lVar6 = *(long *)((long)_arg + 0x18);
  }
  lVar4 = (lVar7 >> 0x3f) + lVar4;
  if (*(short *)(lVar6 + 0x92) == 0) {
    local_10f0.tv_sec = (ulong)g_cdns_cfg.timeout - lVar4;
    local_10f0.tv_usec = -lVar8;
    if (0 < lVar8) {
      local_10f0.tv_sec = local_10f0.tv_sec + -1;
      local_10f0.tv_usec = 1000000 - lVar8;
    }
    iVar3 = event_add(*(undefined8 *)((long)_arg + 0x20),&local_10f0);
    if (iVar3 == 0) {
      return;
    }
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2f5,
               "test_readcb",1,3,"event_add");
  }
  else {
    *(int *)(lVar6 + 0xa4) = (int)lVar4 * 1000 + (int)local_10e0;
  }
LAB_001076e2:
  if (*(long *)((long)_arg + 0x20) != 0) {
    event_free();
  }
  free(_arg);
  evutil_closesocket(fd);
  return;
}

Assistant:

static void test_readcb(int fd, short what, void *_arg)
{
    struct dns_test_request_t * req = _arg;
    struct timeval tv, rtt;
    char   ip_str[INET_ADDR_PORT_STRLEN];
    char   buf[DEFAULT_BUFFER_SIZE];
    size_t pktlen;
    struct dns_header_t * hdr = (struct dns_header_t *)buf;

    if (what & EV_TIMEOUT)
        goto finish;

    pktlen = recvfrom(fd, buf, sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1 || pktlen < sizeof(*hdr) || (hdr->rcode != DNS_RC_NOERROR))
        goto finish;

    if (hdr->id != req->id)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    gettimeofday(&tv, 0);
    timersub(&tv, &req->test_start, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;

    req->server->flags |= SF_TEST_DONE;// Server receives response

    /*
    if (req->server->hijack_threshold > 0 && rtt_ms <= req->server->hijack_threshold) {
        log_error(LOG_DEBUG,
                  "Ignore fast response from %s in %ldms(Threshold: %ums)!",
                  &ip_str[0], rtt_ms, req->server->hijack_threshold);
    }
    */
    if (!(req->server->flags & SF_EDNS_OPT)) {
        req->server->edns_udp_size = dns_get_edns_udp_payload_size(&buf[0], pktlen);

        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            if (is_google_dns((const struct sockaddr *)&req->server->addr)
                && req->server->edns_udp_size != 512) {
                req->server->flags |= SF_HIJACKED;
            }
            if (req->server->flags & SF_HIJACKED) {
                log_error(LOG_INFO, "Oops! DNS server %s is hijacked with UDP payload size: %u",
                          &ip_str[0], req->server->edns_udp_size);
            }
        }
        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            req->server->flags |= SF_EDNS_OPT;
            log_error(LOG_INFO, "Cool! DNS server %s supports EDNS with UDP payload size: %u",
                      &ip_str[0], req->server->edns_udp_size);
        }
    }
    if (!(req->server->flags & (SF_NSCOUNT | SF_HIJACKED))) {
        if (ntohs(hdr->nscount) > 0) {
            req->server->flags |= SF_NSCOUNT;
            log_error(LOG_INFO, "Cool! DNS server %s returns authority records", &ip_str[0]);
        }
    }
    if (req->server->edns_udp_size) {
        // FIXME: update server average rtt
        req->server->stats.avg_rtt = rtt_ms;
    }
    else {
        // Set timeout and wait for next response.
        tv.tv_sec = g_cdns_cfg.timeout;
        tv.tv_usec = 0;
        timersub(&tv, &rtt, &tv);
        if (event_add(req->resolver, &tv)) {
            log_errno(LOG_ERR, "event_add");
            goto finish;
        }    
        return;
    }
finish:
    if (req->resolver)
        event_free(req->resolver);
    free(req);
    evutil_closesocket(fd);
}